

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  cmState *pcVar4;
  pointer pGVar5;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  GeneratorInformation local_718;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_588;
  string *local_580;
  string *local_578;
  GeneratorInfo *local_570;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_568;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_560;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  extraIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_4f0;
  string *local_4e8;
  GeneratorInfo *local_4e0;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_4d8;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_4d0;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  baseIt;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  allocator<char> local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  cmState *local_238;
  cmState *state;
  string cachePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  cmake *local_1a8;
  cmake *cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string platform;
  string toolset;
  string extraGenerator;
  string generator;
  undefined1 local_68 [8];
  string buildDirectory;
  string sourceDirectory;
  string *errorMessage_local;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  pVVar2 = Json::Value::operator[](&request->Data,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&buildDirectory.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)local_68,pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&extraGenerator.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&toolset.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&platform.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)local_f8,pVVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::CollapseFullPath(&local_118,(string *)((long)&buildDirectory.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(buildDirectory.field_2._M_local_buf + 8),(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)(buildDirectory.field_2._M_local_buf + 8));
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::CollapseFullPath(&local_138,(string *)local_68);
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_68);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"\"",(allocator<char> *)((long)&cm + 7));
    std::operator+(&local_178,&local_198,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&local_158,&local_178,"\" is missing.");
    setErrorMessage(errorMessage,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cm + 7));
    this_local._7_1_ = 0;
    cm._0_4_ = 1;
    goto LAB_005bd22a;
  }
  local_1a8 = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
  bVar1 = cmsys::SystemTools::PathExists((string *)local_68);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_68);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"\"",(allocator<char> *)(cachePath.field_2._M_local_buf + 0xf)
                );
      std::operator+(&local_1e8,&local_208,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&local_1c8,&local_1e8,"\" exists but is not a directory.");
      setErrorMessage(errorMessage,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      cm._0_4_ = 1;
      goto LAB_005bd22a;
    }
    cmake::FindCacheFile((string *)&state,(string *)local_68);
    bVar1 = cmake::LoadCache(local_1a8,(string *)&state);
    if (bVar1) {
      pcVar4 = cmake::GetState(local_1a8);
      local_238 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"CMAKE_GENERATOR",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"generator",&local_281);
      bVar1 = getOrTestValue(pcVar4,&local_258,(string *)((long)&extraGenerator.field_2 + 8),
                             &local_280,errorMessage);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      pcVar4 = local_238;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"CMAKE_EXTRA_GENERATOR",&local_2a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"extra generator",&local_2d1);
        bVar1 = getOrTestValue(pcVar4,&local_2a8,(string *)((long)&toolset.field_2 + 8),&local_2d0,
                               errorMessage);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          bVar1 = getOrTestHomeDirectory
                            (local_238,(string *)((long)&buildDirectory.field_2 + 8),errorMessage);
          pcVar4 = local_238;
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f8,"CMAKE_GENERATOR_TOOLSET",&local_2f9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_320,"toolset",&local_321);
            bVar1 = getOrTestValue(pcVar4,&local_2f8,(string *)((long)&platform.field_2 + 8),
                                   &local_320,errorMessage);
            std::__cxx11::string::~string((string *)&local_320);
            std::allocator<char>::~allocator(&local_321);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::allocator<char>::~allocator(&local_2f9);
            pcVar4 = local_238;
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_348,"CMAKE_GENERATOR_PLATFORM",&local_349);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_370,"platform",&local_371);
              bVar1 = getOrTestValue(pcVar4,&local_348,(string *)local_f8,&local_370,errorMessage);
              std::__cxx11::string::~string((string *)&local_370);
              std::allocator<char>::~allocator(&local_371);
              std::__cxx11::string::~string((string *)&local_348);
              std::allocator<char>::~allocator(&local_349);
              if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_005bc65b;
              this_local._7_1_ = 0;
              cm._0_4_ = 1;
            }
            else {
              this_local._7_1_ = 0;
              cm._0_4_ = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            cm._0_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          cm._0_4_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
        cm._0_4_ = 1;
      }
    }
    else {
LAB_005bc65b:
      cm._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&state);
    if ((int)cm != 0) goto LAB_005bd22a;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&buildDirectory.field_2 + 8));
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::vector
                  ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt);
        cmake::GetRegisteredGenerators
                  (local_1a8,
                   (vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt,
                   true);
        local_4d8._M_current =
             (GeneratorInfo *)
             std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                       ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                        &baseIt);
        local_4e0 = (GeneratorInfo *)
                    std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                              ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                                *)&baseIt);
        local_4e8 = (string *)((long)&extraGenerator.field_2 + 8);
        local_4d0 = std::
                    find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                              (local_4d8,
                               (__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                )local_4e0,(anon_class_8_1_26b32173_for__M_pred)local_4e8);
        local_4f0._M_current =
             (GeneratorInfo *)
             std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                       ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                        &baseIt);
        bVar1 = __gnu_cxx::operator==(&local_4d0,&local_4f0);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_550,"Generator \"",
                     (allocator<char> *)((long)&extraIt._M_current + 7));
          std::operator+(&local_530,&local_550,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&extraGenerator.field_2 + 8));
          std::operator+(&local_510,&local_530,"\" not supported.");
          setErrorMessage(errorMessage,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_530);
          std::__cxx11::string::~string((string *)&local_550);
          std::allocator<char>::~allocator((allocator<char> *)((long)&extraIt._M_current + 7));
          this_local._7_1_ = 0;
        }
        else {
          local_568._M_current =
               (GeneratorInfo *)
               std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                         ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                          &baseIt);
          local_570 = (GeneratorInfo *)
                      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                                ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                                  *)&baseIt);
          local_580 = (string *)((long)&extraGenerator.field_2 + 8);
          local_578 = (string *)((long)&toolset.field_2 + 8);
          __pred.extraGenerator = local_578;
          __pred.generator = local_580;
          local_560 = std::
                      find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                (local_568,
                                 (__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                  )local_570,__pred);
          local_588._M_current =
               (GeneratorInfo *)
               std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                         ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                          &baseIt);
          bVar1 = __gnu_cxx::operator==(&local_560,&local_588);
          if (bVar1) {
            std::operator+(&local_608,"The combination of generator \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&extraGenerator.field_2 + 8));
            std::operator+(&local_5e8,&local_608,"\" and extra generator \"");
            std::operator+(&local_5c8,&local_5e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&toolset.field_2 + 8));
            std::operator+(&local_5a8,&local_5c8,"\" is not supported.");
            setErrorMessage(errorMessage,&local_5a8);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5e8);
            std::__cxx11::string::~string((string *)&local_608);
            this_local._7_1_ = 0;
          }
          else {
            pGVar5 = __gnu_cxx::
                     __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                     ::operator->(&local_560);
            if (((pGVar5->supportsToolset & 1U) == 0) &&
               (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_628,
                         "Toolset was provided but is not supported by the requested generator.",
                         &local_629);
              setErrorMessage(errorMessage,&local_628);
              std::__cxx11::string::~string((string *)&local_628);
              std::allocator<char>::~allocator(&local_629);
              this_local._7_1_ = 0;
            }
            else {
              pGVar5 = __gnu_cxx::
                       __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                       ::operator->(&local_560);
              if (((pGVar5->supportsPlatform & 1U) == 0) &&
                 (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_650,
                           "Platform was provided but is not supported by the requested generator.",
                           &local_651);
                setErrorMessage(errorMessage,&local_650);
                std::__cxx11::string::~string((string *)&local_650);
                std::allocator<char>::~allocator(&local_651);
                this_local._7_1_ = 0;
              }
              else {
                std::__cxx11::string::string
                          ((string *)&local_738,(string *)(extraGenerator.field_2._M_local_buf + 8))
                ;
                std::__cxx11::string::string
                          ((string *)&local_758,(string *)(toolset.field_2._M_local_buf + 8));
                std::__cxx11::string::string
                          ((string *)&local_778,(string *)(platform.field_2._M_local_buf + 8));
                std::__cxx11::string::string((string *)&local_798,(string *)local_f8);
                std::__cxx11::string::string
                          ((string *)&local_7b8,(string *)(buildDirectory.field_2._M_local_buf + 8))
                ;
                std::__cxx11::string::string((string *)&local_7d8,(string *)local_68);
                GeneratorInformation::GeneratorInformation
                          (&local_718,&local_738,&local_758,&local_778,&local_798,&local_7b8,
                           &local_7d8);
                GeneratorInformation::operator=(&this->GeneratorInfo,&local_718);
                GeneratorInformation::~GeneratorInformation(&local_718);
                std::__cxx11::string::~string((string *)&local_7d8);
                std::__cxx11::string::~string((string *)&local_7b8);
                std::__cxx11::string::~string((string *)&local_798);
                std::__cxx11::string::~string((string *)&local_778);
                std::__cxx11::string::~string((string *)&local_758);
                std::__cxx11::string::~string((string *)&local_738);
                this->m_State = STATE_ACTIVE;
                this_local._7_1_ = 1;
              }
            }
          }
        }
        cm._0_4_ = 1;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                  ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"\"",
                   (allocator<char> *)
                   ((long)&generators.
                           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::operator+(&local_488,&local_4a8,&kGENERATOR_KEY_abi_cxx11_);
        std::operator+(&local_468,&local_488,"\" is unset but required.");
        setErrorMessage(errorMessage,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&generators.
                           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_local._7_1_ = 0;
        cm._0_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"\"",&local_441);
      std::operator+(&local_420,&local_440,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&local_400,&local_420,"\" is not a directory.");
      setErrorMessage(errorMessage,&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      this_local._7_1_ = 0;
      cm._0_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"\"",&local_3d9);
    std::operator+(&local_3b8,&local_3d8,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&local_398,&local_3b8,"\" is unset but required.");
    setErrorMessage(errorMessage,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    this_local._7_1_ = 0;
    cm._0_4_ = 1;
  }
LAB_005bd22a:
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(platform.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(toolset.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(extraGenerator.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(buildDirectory.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  std::string buildDirectory = request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  // normalize source and build directory
  if (!sourceDirectory.empty()) {
    sourceDirectory = cmSystemTools::CollapseFullPath(sourceDirectory);
    cmSystemTools::ConvertToUnixSlashes(sourceDirectory);
  }
  if (!buildDirectory.empty()) {
    buildDirectory = cmSystemTools::CollapseFullPath(buildDirectory);
    cmSystemTools::ConvertToUnixSlashes(buildDirectory);
  }

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage,
                      std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cmake::FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!getOrTestValue(state, "CMAKE_GENERATOR", generator, "generator",
                          errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!getOrTestValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                          "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!getOrTestHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                          errorMessage)) {
        return false;
      }

      // check platform:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_PLATFORM", platform,
                          "platform", errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}